

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

void __thiscall helics::EndpointInfo::removeTarget(EndpointInfo *this,GlobalHandle targetId)

{
  pointer pEVar1;
  iterator __last;
  pointer ppVar2;
  pointer pEVar3;
  long lVar4;
  GlobalFederateId GVar5;
  InterfaceHandle IVar6;
  EndpointInformation *targetInfo;
  pointer pEVar7;
  iterator iVar8;
  
  pEVar7 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  GVar5 = targetId.fed_id.gid;
  IVar6 = targetId.handle.hid;
  if (pEVar7 != pEVar1) {
    lVar4 = ((long)pEVar1 - (long)pEVar7 >> 3) * -0x71c71c71c71c71c7 >> 2;
    pEVar3 = pEVar7;
    if (0 < lVar4) {
      pEVar3 = pEVar7 + lVar4 * 4;
      lVar4 = lVar4 + 1;
      iVar8._M_current = pEVar7 + 2;
      do {
        if ((iVar8._M_current[-2].id.fed_id.gid == GVar5.gid) &&
           (iVar8._M_current[-2].id.handle.hid == IVar6.hid)) {
          iVar8._M_current = iVar8._M_current + -2;
          goto LAB_002db51d;
        }
        if ((iVar8._M_current[-1].id.fed_id.gid == GVar5.gid) &&
           (iVar8._M_current[-1].id.handle.hid == IVar6.hid)) {
          iVar8._M_current = iVar8._M_current + -1;
          goto LAB_002db51d;
        }
        if ((((iVar8._M_current)->id).fed_id.gid == GVar5.gid) &&
           (((iVar8._M_current)->id).handle.hid == IVar6.hid)) goto LAB_002db51d;
        if ((iVar8._M_current[1].id.fed_id.gid == GVar5.gid) &&
           (iVar8._M_current[1].id.handle.hid == IVar6.hid)) {
          iVar8._M_current = iVar8._M_current + 1;
          goto LAB_002db51d;
        }
        lVar4 = lVar4 + -1;
        iVar8._M_current = iVar8._M_current + 4;
      } while (1 < lVar4);
    }
    lVar4 = ((long)pEVar1 - (long)pEVar3 >> 3) * -0x71c71c71c71c71c7;
    if (lVar4 == 1) {
LAB_002db506:
      iVar8._M_current = pEVar3;
      if (IVar6.hid != (pEVar3->id).handle.hid || (pEVar3->id).fed_id.gid != GVar5.gid) {
        iVar8._M_current = pEVar1;
      }
    }
    else if (lVar4 == 2) {
LAB_002db4c2:
      if (((pEVar3->id).fed_id.gid != GVar5.gid) ||
         (iVar8._M_current = pEVar3, (pEVar3->id).handle.hid != IVar6.hid)) {
        pEVar3 = pEVar3 + 1;
        goto LAB_002db506;
      }
    }
    else {
      iVar8._M_current = pEVar1;
      if ((lVar4 == 3) &&
         (((pEVar3->id).fed_id.gid != GVar5.gid ||
          (iVar8._M_current = pEVar3, (pEVar3->id).handle.hid != IVar6.hid)))) {
        pEVar3 = pEVar3 + 1;
        goto LAB_002db4c2;
      }
    }
LAB_002db51d:
    pEVar7 = iVar8._M_current;
    if (iVar8._M_current != pEVar1) {
      while (pEVar7 = pEVar7 + 1, pEVar7 != pEVar1) {
        if (((pEVar7->id).fed_id.gid != GVar5.gid) || ((pEVar7->id).handle.hid != IVar6.hid)) {
          (iVar8._M_current)->id = pEVar7->id;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(iVar8._M_current)->key,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar7->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(iVar8._M_current)->type,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar7->type);
          iVar8._M_current = iVar8._M_current + 1;
        }
      }
    }
    __last._M_current =
         (this->targetInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current != __last._M_current) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
      _M_erase(&this->targetInformation,iVar8,__last);
      ppVar2 = (this->targets).
               super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
        (this->targets).
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      pEVar7 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar7 != pEVar1) {
        do {
          std::
          vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
          ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                      *)&this->targets,&pEVar7->id,&pEVar7->key);
          pEVar7 = pEVar7 + 1;
        } while (pEVar7 != pEVar1);
      }
    }
  }
  pEVar7 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar7 == pEVar1) {
    return;
  }
  lVar4 = ((long)pEVar1 - (long)pEVar7 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pEVar3 = pEVar7;
  if (0 < lVar4) {
    pEVar3 = pEVar7 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    iVar8._M_current = pEVar7 + 2;
    do {
      if ((iVar8._M_current[-2].id.fed_id.gid == GVar5.gid) &&
         (iVar8._M_current[-2].id.handle.hid == IVar6.hid)) {
        iVar8._M_current = iVar8._M_current + -2;
        goto LAB_002db70e;
      }
      if ((iVar8._M_current[-1].id.fed_id.gid == GVar5.gid) &&
         (iVar8._M_current[-1].id.handle.hid == IVar6.hid)) {
        iVar8._M_current = iVar8._M_current + -1;
        goto LAB_002db70e;
      }
      if ((((iVar8._M_current)->id).fed_id.gid == GVar5.gid) &&
         (((iVar8._M_current)->id).handle.hid == IVar6.hid)) goto LAB_002db70e;
      if ((iVar8._M_current[1].id.fed_id.gid == GVar5.gid) &&
         (iVar8._M_current[1].id.handle.hid == IVar6.hid)) {
        iVar8._M_current = iVar8._M_current + 1;
        goto LAB_002db70e;
      }
      lVar4 = lVar4 + -1;
      iVar8._M_current = iVar8._M_current + 4;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pEVar1 - (long)pEVar3 >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      iVar8._M_current = pEVar1;
      if ((lVar4 != 3) ||
         (((pEVar3->id).fed_id.gid == GVar5.gid &&
          (iVar8._M_current = pEVar3, (pEVar3->id).handle.hid == IVar6.hid)))) goto LAB_002db70e;
      pEVar3 = pEVar3 + 1;
    }
    if (((pEVar3->id).fed_id.gid == GVar5.gid) &&
       (iVar8._M_current = pEVar3, (pEVar3->id).handle.hid == IVar6.hid)) goto LAB_002db70e;
    pEVar3 = pEVar3 + 1;
  }
  iVar8._M_current = pEVar3;
  if (IVar6.hid != (pEVar3->id).handle.hid || (pEVar3->id).fed_id.gid != GVar5.gid) {
    iVar8._M_current = pEVar1;
  }
LAB_002db70e:
  pEVar7 = iVar8._M_current;
  if (iVar8._M_current != pEVar1) {
    while (pEVar7 = pEVar7 + 1, pEVar7 != pEVar1) {
      if (((pEVar7->id).fed_id.gid != GVar5.gid) || ((pEVar7->id).handle.hid != IVar6.hid)) {
        (iVar8._M_current)->id = pEVar7->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar8._M_current)->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar7->key)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar8._M_current)->type,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar7->type
                 );
        iVar8._M_current = iVar8._M_current + 1;
      }
    }
  }
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::_M_erase
            (&this->sourceInformation,iVar8,
             (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void EndpointInfo::removeTarget(GlobalHandle targetId)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [targetId](const auto& targetInfo) {
                                                 return targetInfo.id == targetId;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator =
            std::remove_if(sourceInformation.begin(),
                           sourceInformation.end(),
                           [targetId](const auto& sinfo) { return sinfo.id == targetId; });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}